

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O2

int32_t u_getIntPropertyMaxValue_63(UProperty which)

{
  int32_t iVar1;
  uint uVar2;
  long lVar3;
  
  if (which < UCHAR_BIDI_CLASS) {
    if ((uint)which < 0x41) {
      return 1;
    }
  }
  else if ((uint)which < 0x1019) {
    lVar3 = (ulong)(uint)(which + 0xfffff000) * 0x20;
    switch(which) {
    case UCHAR_BIDI_CLASS:
    case UCHAR_JOINING_GROUP:
    case UCHAR_JOINING_TYPE:
    case UCHAR_BIDI_PAIRED_BRACKET_TYPE:
      iVar1 = ubidi_getMaxValue_63(which);
      return iVar1;
    case UCHAR_BLOCK:
    case UCHAR_DECOMPOSITION_TYPE:
    case UCHAR_EAST_ASIAN_WIDTH:
    case UCHAR_LINE_BREAK:
    case UCHAR_SCRIPT:
    case UCHAR_GRAPHEME_CLUSTER_BREAK:
    case UCHAR_SENTENCE_BREAK:
    case UCHAR_WORD_BREAK:
      uVar2 = uprv_getMaxValues_63(*(int32_t *)(&intProps + lVar3));
      return (uVar2 & *(uint *)(&DAT_003ee1a4 + lVar3)) >> ((&UNK_003ee1a8)[lVar3] & 0x1f);
    default:
      return *(int32_t *)(&UNK_003ee1a8 + lVar3);
    }
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_getIntPropertyMaxValue(UProperty which) {
    if(which<UCHAR_INT_START) {
        if(UCHAR_BINARY_START<=which && which<UCHAR_BINARY_LIMIT) {
            return 1;  // maximum TRUE for all binary properties
        }
    } else if(which<UCHAR_INT_LIMIT) {
        const IntProperty &prop=intProps[which-UCHAR_INT_START];
        return prop.getMaxValue(prop, which);
    }
    return -1;  // undefined
}